

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O3

log_aspect log_aspect_create(log_impl impl,log_aspect_interface iface,log_aspect_ctor ctor)

{
  int iVar1;
  log_aspect aspect;
  log_aspect_data pvVar2;
  
  if ((iface != (log_aspect_interface)0x0) &&
     (aspect = (log_aspect)malloc(0x38), aspect != (log_aspect)0x0)) {
    aspect->impl = impl;
    aspect->restrict_cb = (log_aspect_restrict_cb)0x0;
    aspect->policies = (log_policy *)0x0;
    aspect->count = 0;
    aspect->size = 0;
    aspect->data = (log_aspect_data)0x0;
    aspect->iface = iface;
    pvVar2 = (*iface->create)(aspect,ctor);
    if (pvVar2 == (log_aspect_data)0x0) {
      if (aspect->policies != (log_policy *)0x0) {
        return aspect;
      }
      if (aspect->size != 0) {
        return aspect;
      }
      iVar1 = log_aspect_reserve(aspect,4);
      if (iVar1 == 0) {
        return aspect;
      }
    }
    free(aspect);
  }
  return (log_aspect)0x0;
}

Assistant:

log_aspect log_aspect_create(log_impl impl, const log_aspect_interface iface, const log_aspect_ctor ctor)
{
	if (iface != NULL)
	{
		log_aspect aspect = malloc(sizeof(struct log_aspect_type));

		if (aspect == NULL)
		{
			return NULL;
		}

		aspect->impl = impl;
		aspect->restrict_cb = NULL;
		aspect->policies = NULL;
		aspect->count = 0;
		aspect->size = 0;
		aspect->data = NULL;
		aspect->iface = iface;

		if (aspect->iface->create(aspect, ctor) != 0)
		{
			free(aspect);

			return NULL;
		}

		if (aspect->policies == NULL && aspect->size == 0)
		{
			if (log_aspect_reserve(aspect, LOG_ASPECT_POLICIES_DEFAULT_SIZE) != 0)
			{
				free(aspect);

				return NULL;
			}
		}

		return aspect;
	}

	return NULL;
}